

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_boxtype.cxx
# Opt level: O0

void fl_up_frame(int x,int y,int w,int h,Fl_Color param_5)

{
  Fl_Color param_4_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  fl_frame2("AAWWMMTT",x,y,w,h);
  return;
}

Assistant:

void fl_up_frame(int x, int y, int w, int h, Fl_Color) {
#if BORDER_WIDTH == 1
  fl_frame2("HHWW",x,y,w,h);
#else
#if BORDER_WIDTH == 2
  fl_frame2("AAWWMMTT",x,y,w,h);
#else
  fl_frame("AAAAWWJJUTNN",x,y,w,h);
#endif
#endif
}